

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

void updateLtlStoreOfNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *tempLtlStore)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  if (tempLtlStore == (Vec_Ptr_t *)0x0) {
    __assert_fail("tempLtlStore != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioUtil.c"
                  ,0xde,"void updateLtlStoreOfNtk(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  if (0 < tempLtlStore->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = tempLtlStore->pArray[lVar6];
      pVVar3 = pNtk->vLtlProperties;
      uVar1 = pVVar3->nCap;
      if (pVVar3->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar1 * 2;
          if (iVar5 <= (int)uVar1) goto LAB_00338482;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar5;
      }
LAB_00338482:
      iVar5 = pVVar3->nSize;
      pVVar3->nSize = iVar5 + 1;
      pVVar3->pArray[iVar5] = pvVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < tempLtlStore->nSize);
  }
  return;
}

Assistant:

void updateLtlStoreOfNtk( Abc_Ntk_t *pNtk, Vec_Ptr_t *tempLtlStore )
{
    int i;
    char *pFormula;

    assert( tempLtlStore != NULL );
    Vec_PtrForEachEntry( char *, tempLtlStore, pFormula, i )
        Vec_PtrPush( pNtk->vLtlProperties, pFormula );
}